

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O1

int __thiscall
WavingSketch<8U,_16U,_4U>::Bucket::Query
          (Bucket *this,Data<4U> *item,uint32_t seed_s,uint32_t seed_incast,bool only_heavy)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  undefined7 in_register_00000081;
  uint uVar6;
  
  uVar3 = 0;
  if ((int)CONCAT71(in_register_00000081,only_heavy) == 0) {
    uVar5 = (*(int *)item->str * 0x16a88000 | (uint)(*(int *)item->str * -0x3361d2af) >> 0x11) *
            0x1b873593;
    uVar3 = seed_incast ^ uVar5;
    uVar3 = (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
    uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 4) * -0x7a143595;
    uVar6 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
    uVar5 = seed_s ^ uVar5;
    uVar3 = (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
    uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 4) * -0x7a143595;
    uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
    uVar3 = (int)this->incast[(uVar6 >> 0x10 ^ uVar6) & 0xf] * COUNT[(uVar3 >> 0x10 ^ uVar3) & 1];
    uVar3 = ~((int)uVar3 >> 0x1f) & uVar3;
  }
  lVar4 = 0;
  do {
    if (*(int *)(this->items[0].str + lVar4) == *(int *)item->str) {
      iVar1 = *(int *)((long)this->counters + lVar4);
      iVar2 = -iVar1;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      return iVar2;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x20);
  return uVar3;
}

Assistant:

int Query(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool only_heavy = false) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type retv = (only_heavy == true) ? 0 : std::max(incast[whichcast] * COUNT[choice], 0);

			for (uint32_t i = 0; i < slot_num; ++i) {
				if (items[i] == item) {
					return std::abs(counters[i]);
				}
			}
			return retv;
		}